

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::Loss::predict(Loss *this,int32_t k,real threshold,Predictions *heap,State *state)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  _func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *in_RCX;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RDX;
  undefined4 in_ESI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDI;
  undefined4 in_XMM0_Da;
  Vector *in_stack_00000008;
  Predictions *in_stack_00000010;
  
  (*(code *)(in_RDI->
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
            _M_impl.super__Vector_impl_data._M_start[3])(in_RDI,in_RCX);
  findKBest((Loss *)heap,state._4_4_,state._0_4_,in_stack_00000010,in_stack_00000008);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin(in_RDI);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end(in_RDI);
  __first._M_current._4_4_ = in_ESI;
  __first._M_current._0_4_ = in_XMM0_Da;
  std::
  sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
            (__first,in_RDX,in_RCX);
  return;
}

Assistant:

void Loss::predict(
    int32_t k,
    real threshold,
    Predictions& heap,
    Model::State& state) const {
  computeOutput(state);
  findKBest(k, threshold, heap, state.output);
  std::sort_heap(heap.begin(), heap.end(), comparePairs);
}